

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O2

void kj::_::anon_unknown_0::RemovePlus(char *buffer)

{
  size_t sVar1;
  
  while( true ) {
    buffer = strchr(buffer,0x2b);
    if (buffer == (char *)0x0) break;
    sVar1 = strlen(buffer + 1);
    memmove(buffer,buffer + 1,sVar1 + 1);
  }
  return;
}

Assistant:

void RemovePlus(char* buffer) {
  // Remove any + characters because they are redundant and ugly.

  for (;;) {
    buffer = strchr(buffer, '+');
    if (buffer == NULL) {
      return;
    }
    memmove(buffer, buffer + 1, strlen(buffer + 1) + 1);
  }
}